

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void __thiscall rw::StreamMemory::seek(StreamMemory *this,int32 offset,int32 whence)

{
  uint uVar1;
  
  if (whence == 1) {
    this->position = this->position + offset;
  }
  else if (whence == 0) {
    this->position = offset;
  }
  else {
    this->position = this->length - offset;
  }
  uVar1 = this->position;
  if (this->length < uVar1) {
    if (this->capacity < uVar1) {
      this->position = 0xffffffff;
      return;
    }
    this->length = uVar1;
  }
  return;
}

Assistant:

void
StreamMemory::seek(int32 offset, int32 whence)
{
	if(whence == 0)
		this->position = offset;
	else if(whence == 1)
		this->position += offset;
	else
		this->position = this->length-offset;
	if(this->position > this->length){
		// TODO: ideally this would depend on the mode
		if(this->position > this->capacity)
			this->position = S_EOF;
		else
			this->length = this->position;
	}
}